

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11FrameProcessor.cpp
# Opt level: O1

DUPL_RETURN __thiscall
SL::Screen_Capture::X11FrameProcessor::Init
          (X11FrameProcessor *this,shared_ptr<SL::Screen_Capture::Thread_Data> *data,
          Window *selectedwindow)

{
  XShmSegmentInfo *pXVar1;
  long lVar2;
  int iVar3;
  Display *pDVar4;
  XShmSegmentInfo *pXVar5;
  XImage *pXVar6;
  char *pcVar7;
  DUPL_RETURN DVar8;
  
  (this->super_BaseFrameProcessor).Data.
  super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_BaseFrameProcessor).Data.
              super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  pDVar4 = (Display *)XOpenDisplay(0);
  this->SelectedDisplay = pDVar4;
  this->SelectedWindow = selectedwindow->Handle;
  if (pDVar4 == (Display *)0x0) {
    DVar8 = DUPL_RETURN_ERROR_EXPECTED;
  }
  else {
    iVar3 = XDefaultScreen(pDVar4);
    pXVar5 = (XShmSegmentInfo *)operator_new(0x20);
    pXVar5->shmseg = 0;
    *(undefined8 *)&pXVar5->shmid = 0;
    pXVar5->shmaddr = (char *)0x0;
    *(undefined8 *)&pXVar5->readOnly = 0;
    pXVar1 = (this->ShmInfo)._M_t.
             super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
             super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
             super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl;
    (this->ShmInfo)._M_t.
    super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
    super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
    super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl = pXVar5;
    if (pXVar1 != (XShmSegmentInfo *)0x0) {
      operator_delete(pXVar1,0x20);
    }
    lVar2 = *(long *)(this->SelectedDisplay + 0xe8);
    DVar8 = DUPL_RETURN_SUCCESS;
    pXVar6 = (XImage *)
             XShmCreateImage(this->SelectedDisplay,
                             *(undefined8 *)(lVar2 + 0x40 + (long)iVar3 * 0x80),
                             *(undefined4 *)(lVar2 + 0x38 + (long)iVar3 * 0x80),2,0,
                             (this->ShmInfo)._M_t.
                             super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>
                             .super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl,
                             (selectedwindow->Size).x,(selectedwindow->Size).y);
    this->XImage_ = pXVar6;
    iVar3 = shmget(0,(long)pXVar6->height * (long)pXVar6->bytes_per_line,0x3ff);
    pXVar1 = (this->ShmInfo)._M_t.
             super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
             super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
             super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl;
    pXVar1->shmid = iVar3;
    pXVar1->readOnly = 0;
    pcVar7 = (char *)shmat(iVar3,(void *)0x0,0);
    this->XImage_->data = pcVar7;
    ((this->ShmInfo)._M_t.
     super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
     super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
     super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl)->shmaddr = pcVar7;
    XShmAttach(this->SelectedDisplay,
               (this->ShmInfo)._M_t.
               super___uniq_ptr_impl<XShmSegmentInfo,_std::default_delete<XShmSegmentInfo>_>._M_t.
               super__Tuple_impl<0UL,_XShmSegmentInfo_*,_std::default_delete<XShmSegmentInfo>_>.
               super__Head_base<0UL,_XShmSegmentInfo_*,_false>._M_head_impl);
  }
  return DVar8;
}

Assistant:

DUPL_RETURN X11FrameProcessor::Init(std::shared_ptr<Thread_Data> data, const Window& selectedwindow){
        
        auto ret = DUPL_RETURN::DUPL_RETURN_SUCCESS;
        Data = data; 
        SelectedDisplay = XOpenDisplay(NULL);
        SelectedWindow = selectedwindow.Handle;
        if(!SelectedDisplay) {
            return DUPL_RETURN::DUPL_RETURN_ERROR_EXPECTED;
        }
        int scr = XDefaultScreen(SelectedDisplay);

        ShmInfo = std::make_unique<XShmSegmentInfo>();

        XImage_ = XShmCreateImage(SelectedDisplay,
                                DefaultVisual(SelectedDisplay, scr),
                                DefaultDepth(SelectedDisplay, scr),
                                ZPixmap,
                                NULL,
                                ShmInfo.get(),
                                selectedwindow.Size.x,
                                selectedwindow.Size.y);
        ShmInfo->shmid = shmget(IPC_PRIVATE, XImage_->bytes_per_line * XImage_->height, IPC_CREAT | 0777);

        ShmInfo->readOnly = False;
        ShmInfo->shmaddr = XImage_->data = (char*)shmat(ShmInfo->shmid, 0, 0);

        XShmAttach(SelectedDisplay, ShmInfo.get());

        return ret;
    }